

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O1

void LockSignal_SignalShouldBeLocked(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  
  TestRunner::StartTest("LockSignal_SignalShouldBeLocked");
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011a960;
  this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[4]._M_use_count = 0;
  this[4]._M_weak_count = 0;
  this[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[3]._M_use_count = 0;
  this[3]._M_weak_count = 0;
  this[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this[4]._M_use_count = this + 4;
  this[4]._vptr__Sp_counted_base = (_func_int **)(this + 4);
  this[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&this[3]._M_use_count = 1;
  AssertHelper::VerifyValue(true,true,"Signal should be locked.");
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  return;
}

Assistant:

void LockSignal_SignalShouldBeLocked()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void()> sg;

	sg.set_lock(true);

	AssertHelper::VerifyValue(sg.is_locked(), true, "Signal should be locked.");
}